

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O1

uint64_t lzma_outq_memusage(uint64_t buf_size_max,uint32_t threads)

{
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffff;
  if (threads < 0x4001) {
    uVar1 = (threads * 2) * buf_size_max + 0x30 + (ulong)(threads * 2) * 0x28;
  }
  return -(ulong)(buf_size_max >> 0x30 != 0) | uVar1;
}

Assistant:

extern uint64_t
lzma_outq_memusage(uint64_t buf_size_max, uint32_t threads)
{
	uint64_t bufs_alloc_size;
	uint32_t bufs_count;

	if (get_options(&bufs_alloc_size, &bufs_count, buf_size_max, threads)
			!= LZMA_OK)
		return UINT64_MAX;

	return sizeof(lzma_outq) + bufs_count * sizeof(lzma_outbuf)
			+ bufs_alloc_size;
}